

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O0

void __thiscall
wavingz::demod::state_machine::sample_sm::bitlock_t::process
          (bitlock_t *this,sample_sm_t *ctx,optional<bool> *sample)

{
  optional<bool> *poVar1;
  bool bVar2;
  idle_t *this_00;
  reference_const_type pbVar3;
  optional<bool> local_3a;
  unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
  local_38;
  unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
  local_30;
  optional<bool> local_23;
  optional<bool> *local_20;
  optional<bool> *sample_local;
  sample_sm_t *ctx_local;
  bitlock_t *this_local;
  
  local_20 = sample;
  sample_local = (optional<bool> *)ctx;
  ctx_local = (sample_sm_t *)this;
  bVar2 = boost::operator==(sample);
  poVar1 = sample_local;
  if (bVar2) {
    boost::optional<bool>::optional(&local_23);
    sample_sm_t::emit((sample_sm_t *)poVar1,&local_23);
    poVar1 = sample_local;
    this_00 = (idle_t *)operator_new(8);
    memset(this_00,0,8);
    idle_t::idle_t(this_00);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>>
    ::unique_ptr<std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>,void>
              ((unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>>
                *)&local_38,this_00);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>>
    ::
    unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>,void>
              ((unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>>
                *)&local_30,&local_38);
    sample_sm_t::state((sample_sm_t *)poVar1,&local_30);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ::~unique_ptr(&local_30);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
    ::~unique_ptr(&local_38);
  }
  else {
    pbVar3 = boost::optional<bool>::operator*(local_20);
    if ((*pbVar3 & 1U) == (this->last_sample & 1U)) {
      this->num_samples = this->num_samples + 1.0;
    }
    else {
      pbVar3 = boost::optional<bool>::operator*(local_20);
      this->last_sample = (bool)(*pbVar3 & 1);
      this->num_samples = (this->samples_per_symbol * 3.0) / 4.0;
    }
    poVar1 = sample_local;
    if (this->samples_per_symbol <= this->num_samples) {
      pbVar3 = boost::optional<bool>::operator*(local_20);
      boost::optional<bool>::optional(&local_3a,pbVar3);
      sample_sm_t::emit((sample_sm_t *)poVar1,&local_3a);
      this->num_samples = this->num_samples - this->samples_per_symbol;
    }
  }
  return;
}

Assistant:

void
bitlock_t::process(sample_sm_t& ctx, const boost::optional<bool>& sample)
{
    // On no signal, return to idle
    if (sample == boost::none)
    {
        ctx.emit(boost::none);
        ctx.state(std::unique_ptr<idle_t>(new idle_t()));
    }
    else
    {
        if(*sample != last_sample)
        {
            last_sample = *sample;
            num_samples = 3.0 * samples_per_symbol / 4.0;
        }
        else
        {
            num_samples = num_samples + 1.0;
        }
        if (num_samples >= samples_per_symbol)
        {
            ctx.emit(*sample);
            num_samples -= samples_per_symbol; // keep alignment
        }
    }
}